

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall Scene::~Scene(Scene *this)

{
  size_type sVar1;
  reference ppMVar2;
  Mesh *pMVar3;
  Skybox *pSVar4;
  int local_14;
  int i;
  Scene *this_local;
  
  if (this->camera != (Camera *)0x0) {
    operator_delete(this->camera);
  }
  for (local_14 = 0; sVar1 = std::vector<Mesh_*,_std::allocator<Mesh_*>_>::size(&this->_childeren),
      (ulong)(long)local_14 < sVar1; local_14 = local_14 + 1) {
    ppMVar2 = std::vector<Mesh_*,_std::allocator<Mesh_*>_>::operator[]
                        (&this->_childeren,(long)local_14);
    pMVar3 = *ppMVar2;
    if (pMVar3 != (Mesh *)0x0) {
      Mesh::~Mesh(pMVar3);
      operator_delete(pMVar3);
    }
  }
  pMVar3 = getLamp(this);
  if ((pMVar3 != (Mesh *)0x0) && (pMVar3 = getLamp(this), pMVar3 != (Mesh *)0x0)) {
    Mesh::~Mesh(pMVar3);
    operator_delete(pMVar3);
  }
  pSVar4 = getSkybox(this);
  if ((pSVar4 != (Skybox *)0x0) && (pSVar4 = getSkybox(this), pSVar4 != (Skybox *)0x0)) {
    Skybox::~Skybox(pSVar4);
    operator_delete(pSVar4);
  }
  std::vector<Mesh_*,_std::allocator<Mesh_*>_>::~vector(&this->_childeren);
  return;
}

Assistant:

Scene::~Scene() {
	delete this->camera;
	for (int i = 0; i < this->_childeren.size(); i++) {
		delete this->_childeren[i];
	}
	if (this->getLamp() != NULL) {
		delete this->getLamp();
	}
	if (this->getSkybox() != NULL) {
		delete this->getSkybox();
	}
}